

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WOZ.cpp
# Opt level: O2

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::WOZ::get_track_at_position(WOZ *this,Address address)

{
  FileHolder *this_00;
  undefined8 uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  long offset;
  pthread_mutex_t *__mutex;
  ushort uVar4;
  size_t in_RCX;
  Address in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  size_t number_of_bits;
  shared_ptr<Storage::Disk::Track> sVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> track_contents;
  undefined1 local_98 [16];
  
  offset = file_offset((WOZ *)address,in_RDX);
  if (offset == 0) {
    (this->super_DiskImage)._vptr_DiskImage = (_func_int **)0x0;
    (this->file_).file_ = (FILE *)0x0;
    _Var5._M_pi = extraout_RDX;
  }
  else {
    track_contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    track_contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    track_contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = (FileHolder *)((long)address + 8);
    __mutex = (pthread_mutex_t *)FileHolder::get_file_access_mutex(this_00);
    std::mutex::lock((mutex *)&__mutex->__data);
    FileHolder::seek(this_00,offset,0);
    if (*(int *)((long)address + 0xf0) == 0) {
      FileHolder::read((FileHolder *)&stack0xffffffffffffff78,(int)this_00,(void *)0x19f6,in_RCX);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&track_contents,
                 (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &stack0xffffffffffffff78);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &stack0xffffffffffffff78);
      FileHolder::seek(this_00,2,1);
      uVar2 = FileHolder::get16le(this_00);
      uVar4 = 0xcfb0;
      if (uVar2 < 0xcfb0) {
        uVar4 = uVar2;
      }
      number_of_bits = (size_t)uVar4;
    }
    else {
      uVar2 = FileHolder::get16le(this_00);
      FileHolder::seek(this_00,2,1);
      uVar3 = FileHolder::get32le(this_00);
      FileHolder::seek(this_00,(ulong)uVar2 << 9,0);
      number_of_bits = (size_t)uVar3;
      FileHolder::read((FileHolder *)&stack0xffffffffffffff78,(int)this_00,
                       (void *)(number_of_bits + 7 >> 3),in_RCX);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&track_contents,
                 (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &stack0xffffffffffffff78);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &stack0xffffffffffffff78);
    }
    pthread_mutex_unlock(__mutex);
    PCMSegment::PCMSegment
              ((PCMSegment *)&stack0xffffffffffffff78,number_of_bits,
               track_contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
    std::make_shared<Storage::Disk::PCMTrack,Storage::Disk::PCMSegment>((PCMSegment *)local_98);
    uVar1 = local_98._8_8_;
    local_98._8_8_ = (_Bit_type *)0x0;
    (this->super_DiskImage)._vptr_DiskImage = (_func_int **)local_98._0_8_;
    (this->file_).file_ = (FILE *)uVar1;
    local_98._0_4_ = 0;
    local_98._4_4_ = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    PCMSegment::~PCMSegment((PCMSegment *)&stack0xffffffffffffff78);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&track_contents.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    _Var5._M_pi = extraout_RDX_00;
  }
  sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> WOZ::get_track_at_position(Track::Address address) {
	const long offset = file_offset(address);
	if(offset == NoSuchTrack) {
		return nullptr;
	}

	// Seek to the real track.
	std::vector<uint8_t> track_contents;
	size_t number_of_bits;
	{
		std::lock_guard lock_guard(file_.get_file_access_mutex());
		file_.seek(offset, SEEK_SET);

		switch(type_) {
			case Type::WOZ1:
				// In WOZ 1, a track is up to 6646 bytes of data, followed by a two-byte record of the
				// number of bytes that actually had data in them, then a two-byte count of the number
				// of bits that were used. Other information follows but is not intended for emulation.
				track_contents = file_.read(6646);
				file_.seek(2, SEEK_CUR);
				number_of_bits = std::min(file_.get16le(), uint16_t(6646*8));
			break;

			default:
			case Type::WOZ2: {
				// In WOZ 2 an extra level of indirection allows for variable track sizes.
				const uint16_t starting_block = file_.get16le();
				file_.seek(2, SEEK_CUR);	// Skip the block count; the amount of data to read is implied by the number of bits.
				number_of_bits = file_.get32le();

				file_.seek(starting_block * 512, SEEK_SET);
				track_contents = file_.read((number_of_bits + 7) >> 3);
			} break;
		}
	}

	return std::make_shared<PCMTrack>(PCMSegment(number_of_bits, track_contents));
}